

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmTextureOffset.cpp
# Opt level: O0

GMM_STATUS __thiscall
GmmLib::GmmTextureCalc::GetTexRenderOffset
          (GmmTextureCalc *this,GMM_TEXTURE_INFO *pTexInfo,GMM_REQ_OFFSET_INFO *pReqInfo)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  uint8_t uVar12;
  uint uVar13;
  uint uVar14;
  GMM_PLATFORM_INFO *pGVar15;
  undefined4 extraout_var;
  ulong local_70;
  GMM_GFX_SIZE_T Pitch;
  GMM_GFX_SIZE_T MipTailByteOffset;
  uint32_t TileAlignedOffsetY;
  uint32_t TileAlignedOffsetX;
  GMM_PLATFORM_INFO *pPlatform;
  uint32_t local_48;
  uint32_t OffsetZ;
  uint32_t OffsetY;
  uint32_t OffsetX;
  GMM_GFX_SIZE_T RenderAlignOffset;
  GMM_GFX_SIZE_T AddressOffset;
  GMM_TILE_INFO *pTileInfo;
  GMM_REQ_OFFSET_INFO *pReqInfo_local;
  GMM_TEXTURE_INFO *pTexInfo_local;
  GmmTextureCalc *this_local;
  
  AddressOffset = 0;
  RenderAlignOffset = 0;
  _OffsetY = 0;
  OffsetZ = 0;
  local_48 = 0;
  pPlatform._4_4_ = 0;
  if (pTexInfo == (GMM_TEXTURE_INFO *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else if (pReqInfo == (GMM_REQ_OFFSET_INFO *)0x0) {
    this_local._4_4_ = GMM_ERROR;
  }
  else {
    pTileInfo = (GMM_TILE_INFO *)pReqInfo;
    pReqInfo_local = (GMM_REQ_OFFSET_INFO *)pTexInfo;
    pTexInfo_local = (GMM_TEXTURE_INFO *)this;
    pGVar15 = GmmGetPlatformInfo(this->pGmmLibContext);
    AddressOffset = (GMM_GFX_SIZE_T)(pGVar15->TileInfo + pReqInfo_local[4].Render.field_0.Offset);
    uVar13 = (*this->_vptr_GmmTextureCalc[0x10])(this,pReqInfo_local,pTileInfo);
    RenderAlignOffset = CONCAT44(extraout_var,uVar13);
    if (*(int *)(AddressOffset + 0xc) == 0) {
      _OffsetY = RenderAlignOffset - ((ulong)uVar13 & 3);
      if (pReqInfo_local[2].Render.field_0.Offset64 == 0) {
        OffsetZ = uVar13 - (int)_OffsetY;
        local_48 = 0;
      }
      else {
        OffsetZ = (uint32_t)
                  ((RenderAlignOffset - _OffsetY) % pReqInfo_local[2].Render.field_0.Offset64);
        local_48 = (uint32_t)
                   ((RenderAlignOffset - _OffsetY) / pReqInfo_local[2].Render.field_0.Offset64);
      }
    }
    else {
      MipTailByteOffset._0_4_ = 0;
      uVar1._0_4_ = pReqInfo_local->Plane;
      uVar1._4_4_ = pReqInfo_local->Frame;
      if (((((uVar1 >> 0x25 & 1) != 0) ||
           (uVar2._0_4_ = pReqInfo_local->Plane, uVar2._4_4_ = pReqInfo_local->Frame,
           (uVar2 >> 0x26 & 1) != 0)) ||
          (uVar3._0_4_ = pReqInfo_local->Plane, uVar3._4_4_ = pReqInfo_local->Frame,
          (uVar3 >> 0x2c & 1) != 0)) &&
         (*(uint *)((long)&(pReqInfo_local->StdLayout).TileDepthPitch + 4) <=
          pTileInfo->LogicalTileDepth)) {
        uVar13 = (*this->_vptr_GmmTextureCalc[9])
                           (this,pReqInfo_local,(ulong)pTileInfo->LogicalTileDepth);
        RenderAlignOffset = RenderAlignOffset - uVar13;
      }
      uVar4._0_4_ = pReqInfo_local->Plane;
      uVar4._4_4_ = pReqInfo_local->Frame;
      if ((uVar4 >> 0x1c & 1) == 0) {
        local_70 = pReqInfo_local[2].Render.field_0.Offset64;
        if (pReqInfo_local[2].Render.field_0.Offset64 == 0) {
          local_70 = *(ulong *)&pReqInfo_local[2].Render.ZOffset;
        }
        uVar5._0_4_ = pReqInfo_local->Slice;
        uVar5._4_4_ = pReqInfo_local->CubeFace;
        if (((uVar5 >> 0x1d & 1) == 0) ||
           (uVar6._0_4_ = pReqInfo_local->Plane, uVar6._4_4_ = pReqInfo_local->Frame,
           (uVar6 >> 0x22 & 1) == 0)) {
          uVar13 = (uint)(RenderAlignOffset % local_70);
          MipTailByteOffset._4_4_ = uVar13 - (uVar13 & *(int *)AddressOffset - 1U);
          OffsetZ = uVar13 - MipTailByteOffset._4_4_;
        }
        else {
          uVar13 = (uint)(RenderAlignOffset % local_70);
          MipTailByteOffset._4_4_ = uVar13 - (uVar13 & (*(uint *)AddressOffset >> 1) - 1);
          OffsetZ = uVar13 - MipTailByteOffset._4_4_;
        }
        if (pReqInfo_local[2].Render.field_0.Offset64 != 0) {
          uVar7._0_4_ = pReqInfo_local->Slice;
          uVar7._4_4_ = pReqInfo_local->CubeFace;
          if (((uVar7 >> 0x1d & 1) == 0) ||
             (uVar8._0_4_ = pReqInfo_local->Plane, uVar8._4_4_ = pReqInfo_local->Frame,
             (uVar8 >> 0x22 & 1) == 0)) {
            uVar13 = (uint)(RenderAlignOffset / pReqInfo_local[2].Render.field_0.Offset64);
            MipTailByteOffset._0_4_ =
                 uVar13 - (uVar13 & *(int *)(AddressOffset + 4) * *(int *)(AddressOffset + 8) - 1U);
            local_48 = uVar13 - (uint)MipTailByteOffset;
          }
          else {
            uVar13 = (int)(RenderAlignOffset / pReqInfo_local[2].Render.field_0.Offset64) * 2;
            uVar14 = uVar13 - (uVar13 & *(int *)(AddressOffset + 4) * 2 *
                                        *(int *)(AddressOffset + 8) - 1U);
            local_48 = uVar13 - uVar14;
            MipTailByteOffset._0_4_ = uVar14 >> 1;
          }
        }
        _OffsetY = (ulong)(uint)MipTailByteOffset * pReqInfo_local[2].Render.field_0.Offset64 +
                   (ulong)((MipTailByteOffset._4_4_ / *(uint *)AddressOffset) *
                          *(int *)(AddressOffset + 0xc));
        uVar9._0_4_ = pReqInfo_local->Plane;
        uVar9._4_4_ = pReqInfo_local->Frame;
        if (((((uVar9 >> 0x25 & 1) != 0) ||
             (uVar10._0_4_ = pReqInfo_local->Plane, uVar10._4_4_ = pReqInfo_local->Frame,
             (uVar10 >> 0x26 & 1) != 0)) ||
            (uVar11._0_4_ = pReqInfo_local->Plane, uVar11._4_4_ = pReqInfo_local->Frame,
            (uVar11 >> 0x2c & 1) != 0)) &&
           ((*(uint *)((long)&(pReqInfo_local->StdLayout).TileDepthPitch + 4) <=
             pTileInfo->LogicalTileDepth &&
            (uVar12 = GmmIsPlanar(pReqInfo_local->ArrayIndex), uVar12 == '\0')))) {
          (*this->_vptr_GmmTextureCalc[10])
                    (this,pReqInfo_local,(ulong)pTileInfo->LogicalTileDepth,&OffsetZ,&local_48,
                     (long)&pPlatform + 4);
        }
      }
      else {
        _OffsetY = RenderAlignOffset;
        pPlatform._4_4_ = 0;
        local_48 = 0;
        OffsetZ = 0;
      }
    }
    pTileInfo[1].MaxPitch = OffsetY;
    pTileInfo[1].MaxMipTailStartWidth = OffsetX;
    pTileInfo[1].MaxMipTailStartHeight = OffsetZ;
    pTileInfo[1].MaxMipTailStartDepth = local_48;
    pTileInfo[2].LogicalTileWidth = pPlatform._4_4_;
    this_local._4_4_ = GMM_SUCCESS;
  }
  return this_local._4_4_;
}

Assistant:

GMM_STATUS GmmLib::GmmTextureCalc::GetTexRenderOffset(GMM_TEXTURE_INFO *   pTexInfo,
                                                      GMM_REQ_OFFSET_INFO *pReqInfo)
{

    const GMM_TILE_INFO *    pTileInfo         = NULL;
    GMM_GFX_SIZE_T           AddressOffset     = 0;
    GMM_GFX_SIZE_T           RenderAlignOffset = 0;
    uint32_t                 OffsetX           = 0;
    uint32_t                 OffsetY           = 0;
    uint32_t                 OffsetZ           = 0;
    const GMM_PLATFORM_INFO *pPlatform         = NULL;

    __GMM_ASSERTPTR(pTexInfo, GMM_ERROR);
    __GMM_ASSERTPTR(pReqInfo, GMM_ERROR);

    pPlatform     = GMM_OVERRIDE_PLATFORM_INFO(pTexInfo, pGmmLibContext);
    pTileInfo     = &pPlatform->TileInfo[pTexInfo->TileMode];
    AddressOffset = GetMipMapByteAddress(pTexInfo, pReqInfo);

    if(GMM_IS_TILED(*pTileInfo))
    {
        uint32_t       TileAlignedOffsetX = 0;
        uint32_t       TileAlignedOffsetY = 0;
        GMM_GFX_SIZE_T MipTailByteOffset  = 0;

        //--- Compute Tile-Aligned Offset, and Corresponding X/Y Offsets -------
        // Render/Tiled-Aligned offsets and corresponding X/Y offsets are used
        // to program the Surface Base Address and X/Y Offset fields of a
        // SURFACE_STATE. For a given subresource, the tiled-aligned offset
        // addresses the tile containing the base of the subresource; the X/Y
        // offsets then give the additional offsets into the tile of the
        // subresource base. (Though in SURFACE_STATE, X Offset is specified in
        // pixels, this function will return the X Offset in bytes. Y Offset is
        // in pixel rows.)

        if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
           (pReqInfo->MipLevel >= pTexInfo->Alignment.MipTailStartLod))
        {
            MipTailByteOffset = GetMipTailByteOffset(pTexInfo, pReqInfo->MipLevel);

            // For MipTail, Offset is really with respect to start of MipTail,
            // so taking out individual Mipoffset within miptail region to get correct Tile aligned offset.
            AddressOffset -= MipTailByteOffset;
        }

        if(!pTexInfo->Flags.Info.RedecribedPlanes)
        {
            GMM_GFX_SIZE_T Pitch = pTexInfo->Pitch;
            if(!pTexInfo->Pitch)
            {
                // If no pitch exists, but the surface is still marked as tiled, then it is a 1D TileYf/Ys surface.
                // Technically no pitch exists for 1D surfaces, but we will fake it to make calculations work below.
                // Since 1D surfaces only have an X-dimension, this Pitch calculation is only used for OffsetX calculation.
                Pitch = pTexInfo->Size;
            }
	    
	    if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
            {
                OffsetX            = GFX_ULONG_CAST(AddressOffset % Pitch);
                TileAlignedOffsetX = GFX_ALIGN_FLOOR(OffsetX, pTileInfo->LogicalTileWidth / 2);
                OffsetX -= TileAlignedOffsetX;
            }
            else
            {
                OffsetX            = GFX_ULONG_CAST(AddressOffset % Pitch);
                TileAlignedOffsetX = GFX_ALIGN_FLOOR(OffsetX, pTileInfo->LogicalTileWidth);
                OffsetX -= TileAlignedOffsetX;
            }

            if(pTexInfo->Pitch)
            {
                if(pTexInfo->Flags.Gpu.SeparateStencil && pTexInfo->Flags.Info.TiledW)
                {
                    //Expt: YOffset ignore row-interleave -- verify both 2d/3d mips
                    OffsetY = GFX_ULONG_CAST(AddressOffset / pTexInfo->Pitch);
                    OffsetY *= 2;
                    TileAlignedOffsetY = GFX_ALIGN_FLOOR(OffsetY, pTileInfo->LogicalTileHeight * 2 * pTileInfo->LogicalTileDepth);
                    OffsetY -= TileAlignedOffsetY;
                    TileAlignedOffsetY /= 2;
                }
                else
                {
                    OffsetY            = GFX_ULONG_CAST(AddressOffset / pTexInfo->Pitch);
                    TileAlignedOffsetY = GFX_ALIGN_FLOOR(OffsetY, pTileInfo->LogicalTileHeight * pTileInfo->LogicalTileDepth);
                    OffsetY -= TileAlignedOffsetY;
                }
            }

            RenderAlignOffset =
            TileAlignedOffsetY * pTexInfo->Pitch +
            (TileAlignedOffsetX / pTileInfo->LogicalTileWidth) * pTileInfo->LogicalSize;

            // For Gen9+, Miptail Lods should be reported in a way that
            //      - Base Address equals tile-aligned "Miptail start address"
            //      - OffsetX equals to offset (in bytes) from "Miptail start Lod" to "current Lod" in geometric X direction
            //      - OffsetY and OffsetZ are their pixel distance from "Miptail start Lod" to "current Lod" in geometric Y, Z directions
            // Note: only Tile Yf and TileYs have Miptails and their Mips are always "tile aligned"

            if((pTexInfo->Flags.Info.TiledYf || GMM_IS_64KB_TILE(pTexInfo->Flags)) &&
               (pReqInfo->MipLevel >= pTexInfo->Alignment.MipTailStartLod) &&
               // Planar surfaces do not support MIPs
               !GmmIsPlanar(pTexInfo->Format))
            {
                GetMipTailGeometryOffset(pTexInfo, pReqInfo->MipLevel, &OffsetX, &OffsetY, &OffsetZ);
            }
        }
        else
        {
            // Std swizzled and UV packed planes begin at tile-aligned
            // offsets and do not support MIPs, so no adjustment is needed
            RenderAlignOffset = AddressOffset;
            OffsetX = OffsetY = OffsetZ = 0;
        }
    }
    else
    {
        // Linear case make sure Render address is DWORD aligned.
        RenderAlignOffset = GFX_ALIGN_FLOOR(AddressOffset, GMM_BYTES(4));

        if(pTexInfo->Pitch)
        {
            OffsetX = GFX_ULONG_CAST((AddressOffset - RenderAlignOffset) % pTexInfo->Pitch);
            OffsetY = GFX_ULONG_CAST((AddressOffset - RenderAlignOffset) / pTexInfo->Pitch);
        }
        else
        {
            // One-dimensional textures (no height)
            OffsetX = GFX_ULONG_CAST(AddressOffset - RenderAlignOffset);
            OffsetY = 0;
        }
    }

    pReqInfo->Render.Offset64 = RenderAlignOffset;
    pReqInfo->Render.XOffset  = GFX_ULONG_CAST(OffsetX);
    pReqInfo->Render.YOffset  = GFX_ULONG_CAST(OffsetY);
    pReqInfo->Render.ZOffset  = GFX_ULONG_CAST(OffsetZ);

    return GMM_SUCCESS;
}